

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O2

void slider_check_minmax(t_slider *x,double min,double max,t_float value)

{
  double dVar1;
  
  if (x->x_lin0_log1 == 0) {
    x->x_min = min;
    x->x_max = max;
    dVar1 = max - min;
  }
  else {
    dVar1 = (double)(~-(ulong)(min == 0.0) & (ulong)max |
                    (~-(ulong)(max == 0.0) & (ulong)max | -(ulong)(max == 0.0) & 0x3ff0000000000000)
                    & -(ulong)(min == 0.0));
    if (dVar1 <= 0.0) {
      if (0.0 < min) {
        dVar1 = min * 0.01;
      }
    }
    else if (min <= 0.0) {
      min = dVar1 * 0.01;
    }
    x->x_min = min;
    x->x_max = dVar1;
    dVar1 = log(dVar1 / min);
  }
  x->x_k = dVar1 / (double)(value / (float)((x->x_gui).x_glist)->gl_zoom + -1.0);
  return;
}

Assistant:

static void slider_check_minmax(t_slider *x, double min, double max, t_float value)
{
    if(x->x_lin0_log1)
    {
        if((min == 0.0) && (max == 0.0))
            max = 1.0;
        if(max > 0.0)
        {
            if(min <= 0.0)
                min = 0.01 * max;
        }
        else
        {
            if(min > 0.0)
                max = 0.01 * min;
        }
    }
    x->x_min = min;
    x->x_max = max;
    if(x->x_lin0_log1)
        x->x_k = log(x->x_max/x->x_min) / (double)(value/IEMGUI_ZOOM(x) - 1);
    else
        x->x_k = (x->x_max - x->x_min) / (double)(value/IEMGUI_ZOOM(x) - 1);
}